

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

double * __thiscall
TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::Insert
          (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this,FName *key,
          double *value)

{
  Node *pNVar1;
  Node *pNVar2;
  FName local_c;
  
  local_c = (FName)key->Index;
  pNVar1 = this->Nodes + (this->Size - 1 & local_c.Index);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key.Index == local_c.Index) {
LAB_0039e928:
      (pNVar2->Pair).Value = *value;
      return &(pNVar2->Pair).Value;
    }
  }
  pNVar2 = NewKey(this,&local_c);
  goto LAB_0039e928;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}